

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFragDepthTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::gles3::Functional::FragDepthWriteCase::iterate(FragDepthWriteCase *this)

{
  RenderContext *pRVar1;
  code *pcVar2;
  FragDepthWriteCase *pFVar3;
  bool bVar4;
  int iVar5;
  deUint32 dVar6;
  undefined4 uVar7;
  uint uVar8;
  undefined4 extraout_var;
  int *piVar10;
  NotSupportedError *this_00;
  TestError *pTVar11;
  char *description;
  int x;
  long lVar12;
  int height;
  int y;
  int iVar13;
  float fVar14;
  undefined1 extraout_XMM0 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar21 [16];
  undefined1 extraout_var_01 [12];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  allocator<char> local_2fa;
  allocator<char> local_2f9;
  FragDepthWriteCase *local_2f8;
  int local_2f0;
  int local_2ec;
  TestLog *local_2e8;
  undefined4 local_2dc;
  float coord [8];
  float position [16];
  Vec4 color;
  Surface referenceFrame;
  undefined4 uStack_234;
  Surface renderedFrame;
  string local_208;
  ShaderProgram program;
  VertexArrayBinding vertexArrays [2];
  Random rnd;
  long lVar9;
  undefined4 extraout_var_00;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  
  local_2e8 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  iVar5 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar9 = CONCAT44(extraout_var,iVar5);
  dVar6 = deStringHash((this->super_TestCase).super_TestCase.super_TestNode.m_name._M_dataplus._M_p)
  ;
  deRandom_init(&rnd.m_rnd,dVar6);
  local_2f8 = this;
  iVar5 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[4])();
  piVar10 = (int *)CONCAT44(extraout_var_00,iVar5);
  iVar5 = *piVar10;
  iVar13 = 0x80;
  if (iVar5 < 0x80) {
    iVar13 = iVar5;
  }
  height = 0x80;
  if (piVar10[1] < 0x80) {
    height = piVar10[1];
  }
  local_2ec = de::Random::getInt((Random *)&rnd.m_rnd,0,iVar5 - iVar13);
  local_2f0 = de::Random::getInt((Random *)&rnd.m_rnd,0,piVar10[1] - height);
  tcu::Surface::Surface(&renderedFrame,iVar13,height);
  tcu::Surface::Surface(&referenceFrame,iVar13,height);
  if (piVar10[6] == 0) {
    this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (this_00,"Depth buffer is required","",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fFragDepthTests.cpp"
               ,0x136);
    __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  (**(code **)(lVar9 + 0x1a00))(local_2ec,local_2f0,iVar13,height);
  pFVar3 = local_2f8;
  (**(code **)(lVar9 + 0x188))(0x4500);
  (**(code **)(lVar9 + 0x5e0))(0xb71);
  (**(code **)(lVar9 + 0x4a0))(0x201);
  pRVar1 = ((pFVar3->super_TestCase).m_context)->m_renderCtx;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)position,
             "#version 300 es\nin highp vec4 a_position;\nin highp vec2 a_coord;\nout highp vec2 v_coord;\nvoid main (void)\n{\n\tgl_Position = a_position;\n\tv_coord = a_coord;\n}\n"
             ,(allocator<char> *)&color);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)coord,(pFVar3->m_fragSrc)._M_dataplus._M_p,(allocator<char> *)&local_208);
  glu::makeVtxFragSources((ProgramSources *)vertexArrays,(string *)position,(string *)coord);
  glu::ShaderProgram::ShaderProgram(&program,pRVar1,(ProgramSources *)vertexArrays);
  glu::ProgramSources::~ProgramSources((ProgramSources *)vertexArrays);
  std::__cxx11::string::~string((string *)coord);
  std::__cxx11::string::~string((string *)position);
  glu::operator<<(local_2e8,&program);
  if (program.m_program.m_info.linkOk == false) {
    pTVar11 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar11,"Compile failed",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fFragDepthTests.cpp"
               ,0x145);
    __cxa_throw(pTVar11,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  coord[4] = 1.0;
  coord[5] = 0.0;
  coord[6] = 1.0;
  coord[7] = 1.0;
  coord[0] = 0.0;
  coord[1] = 0.0;
  coord[2] = 0.0;
  coord[3] = 1.0;
  position[0xc] = 1.0;
  position[0xd] = 1.0;
  position[0xe] = -1.0;
  position[0xf] = 1.0;
  position[8] = 1.0;
  position[9] = -1.0;
  position[10] = 0.0;
  position[0xb] = 1.0;
  position[4] = -1.0;
  position[5] = 1.0;
  position[6] = 0.0;
  position[7] = 1.0;
  position[0] = -1.0;
  position[1] = -1.0;
  position[2] = 1.0;
  position[3] = 1.0;
  (**(code **)(lVar9 + 0x1680))(program.m_program.m_program);
  pcVar2 = *(code **)(lVar9 + 0x15a0);
  uVar7 = (**(code **)(lVar9 + 0xb48))(program.m_program.m_program,"u_color");
  (*pcVar2)(uVar7);
  deqp::gls::setupDefaultUniforms
            (((pFVar3->super_TestCase).m_context)->m_renderCtx,program.m_program.m_program);
  std::__cxx11::string::string<std::allocator<char>>((string *)&color,"a_position",&local_2f9);
  glu::va::Float(vertexArrays,(string *)&color,4,4,0,position);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_208,"a_coord",&local_2fa);
  glu::va::Float(vertexArrays + 1,&local_208,2,4,0,coord);
  std::__cxx11::string::~string((string *)&local_208);
  std::__cxx11::string::~string((string *)&color);
  color.m_data[0] = 0.0;
  color.m_data[1] = 8.40779e-45;
  color.m_data[2] = 1.4013e-45;
  glu::draw(((pFVar3->super_TestCase).m_context)->m_renderCtx,program.m_program.m_program,2,
            vertexArrays,(PrimitiveList *)&color,(DrawUtilCallback *)0x0);
  lVar12 = 0x58;
  do {
    std::__cxx11::string::~string((string *)((long)&vertexArrays[0].binding.type + lVar12));
    lVar12 = lVar12 + -0x50;
  } while (lVar12 != -0x48);
  dVar6 = (**(code **)(lVar9 + 0x800))();
  glu::checkError(dVar6,"Draw test quad",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fFragDepthTests.cpp"
                  ,0x166);
  glu::ShaderProgram::~ShaderProgram(&program);
  pRVar1 = ((pFVar3->super_TestCase).m_context)->m_renderCtx;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)position,
             "#version 300 es\nin highp vec4 a_position;\nin highp vec2 a_coord;\nout highp vec2 v_coord;\nvoid main (void)\n{\n\tgl_Position = a_position;\n\tv_coord = a_coord;\n}\n"
             ,(allocator<char> *)&color);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)coord,
             "#version 300 es\nuniform highp vec4 u_color;\nlayout(location = 0) out mediump vec4 o_color;\nvoid main (void)\n{\n\to_color = u_color;\n}\n"
             ,(allocator<char> *)&local_208);
  glu::makeVtxFragSources((ProgramSources *)vertexArrays,(string *)position,(string *)coord);
  glu::ShaderProgram::ShaderProgram(&program,pRVar1,(ProgramSources *)vertexArrays);
  glu::ProgramSources::~ProgramSources((ProgramSources *)vertexArrays);
  std::__cxx11::string::~string((string *)coord);
  std::__cxx11::string::~string((string *)position);
  if (program.m_program.m_info.linkOk != false) {
    iVar5 = (**(code **)(lVar9 + 0x780))(program.m_program.m_program,"a_position");
    local_2dc = (**(code **)(lVar9 + 0xb48))(program.m_program.m_program,"u_color");
    (**(code **)(lVar9 + 0x1680))(program.m_program.m_program);
    (**(code **)(lVar9 + 0x4a8))(0);
    for (iVar13 = 0; iVar13 != 0x10; iVar13 = iVar13 + 1) {
      color.m_data[2] = (float)iVar13 * 0.06666667;
      color.m_data[1] = color.m_data[2];
      color.m_data[0] = color.m_data[2];
      position[2] = color.m_data[2] + color.m_data[2] + -1.0;
      color.m_data[3] = 1.0;
      position[0] = -1.0;
      position[1] = -1.0;
      position[3] = 1.0;
      position[4] = -1.0;
      position[5] = 1.0;
      position[7] = 1.0;
      position[8] = 1.0;
      position[9] = -1.0;
      position[0xb] = 1.0;
      position[0xc] = 1.0;
      position[0xd] = 1.0;
      position[0xf] = 1.0;
      position[0xe] = position[2];
      position[6] = position[2];
      position[10] = position[2];
      glu::va::Float(vertexArrays,iVar5,4,4,0,position);
      (**(code **)(lVar9 + 0x15a8))(local_2dc,1,&color);
      coord[0] = 0.0;
      coord[1] = 8.40779e-45;
      coord[2] = 1.4013e-45;
      coord._16_8_ = iterate::quadIndices;
      glu::draw(((local_2f8->super_TestCase).m_context)->m_renderCtx,program.m_program.m_program,1,
                vertexArrays,(PrimitiveList *)coord,(DrawUtilCallback *)0x0);
      std::__cxx11::string::~string((string *)&vertexArrays[0].binding.name);
    }
    dVar6 = (**(code **)(lVar9 + 0x800))();
    glu::checkError(dVar6,"Visualization draw",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fFragDepthTests.cpp"
                    ,0x18c);
    glu::ShaderProgram::~ShaderProgram(&program);
    pRVar1 = ((local_2f8->super_TestCase).m_context)->m_renderCtx;
    tcu::Surface::getAccess((PixelBufferAccess *)&program,&renderedFrame);
    glu::readPixels(pRVar1,local_2ec,local_2f0,(PixelBufferAccess *)&program);
    auVar15 = extraout_XMM0;
    for (iVar5 = 0; auVar16._4_12_ = auVar15._4_12_, iVar5 < referenceFrame.m_height;
        iVar5 = iVar5 + 1) {
      auVar16._0_4_ = (float)iVar5 + 0.5;
      auVar21 = auVar16;
      for (iVar13 = 0; iVar13 < referenceFrame.m_width; iVar13 = iVar13 + 1) {
        auVar17._4_12_ = auVar21._4_12_;
        auVar17._0_4_ = (float)iVar13 + 0.5;
        uStack_234 = auVar15._4_4_;
        auVar19._12_4_ = auVar21._12_4_;
        auVar19._0_8_ = auVar17._0_8_;
        auVar19._8_4_ = auVar21._4_4_;
        auVar18._8_8_ = auVar19._8_8_;
        auVar18._4_4_ = auVar16._0_4_;
        auVar18._0_4_ = auVar17._0_4_;
        auVar20._0_12_ = auVar18._0_12_;
        auVar20._12_4_ = uStack_234;
        auVar23._0_4_ = (float)referenceFrame.m_width;
        auVar23._4_4_ = (float)referenceFrame.m_height;
        auVar23._8_8_ = 0;
        auVar21 = divps(auVar20,auVar23);
        program.m_shaders[0].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>.
        _M_impl.super__Vector_impl_data._M_start = auVar21._0_8_;
        fVar14 = (*local_2f8->m_evalFunc)((Vec2 *)&program);
        fVar14 = floorf(fVar14 / 0.06666667);
        auVar22._0_4_ = (float)(int)fVar14;
        auVar22._4_4_ = (float)(int)extraout_var_01._0_4_;
        auVar22._8_4_ = (float)(int)extraout_var_01._4_4_;
        auVar22._12_4_ = (float)(int)extraout_var_01._8_4_;
        auVar21._4_12_ = auVar22._4_12_;
        fVar14 = auVar22._0_4_ * 0.06666667 * 255.0;
        auVar21._0_4_ = fVar14 + *(float *)(&DAT_009ed69c + (ulong)(fVar14 < 0.0) * 4);
        uVar8 = (uint)auVar21._0_4_;
        if (0xfe < (int)uVar8) {
          uVar8 = 0xff;
        }
        if ((int)uVar8 < 1) {
          uVar8 = 0;
        }
        *(uint *)((long)referenceFrame.m_pixels.m_ptr +
                 (long)(referenceFrame.m_width * iVar5 + iVar13) * 4) =
             uVar8 << 0x10 | uVar8 << 8 | uVar8 | 0xff000000;
      }
      auVar15 = auVar21;
    }
    bVar4 = tcu::fuzzyCompare(local_2e8,"Result","Image comparison result",&referenceFrame,
                              &renderedFrame,0.05,COMPARE_LOG_RESULT);
    description = "Fail";
    if (bVar4) {
      description = "Pass";
    }
    tcu::TestContext::setTestResult
              ((local_2f8->super_TestCase).super_TestCase.super_TestNode.m_testCtx,(uint)!bVar4,
               description);
    tcu::Surface::~Surface(&referenceFrame);
    tcu::Surface::~Surface(&renderedFrame);
    return STOP;
  }
  glu::operator<<(local_2e8,&program);
  pTVar11 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (pTVar11,"Compile failed",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fFragDepthTests.cpp"
             ,0x16f);
  __cxa_throw(pTVar11,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

FragDepthWriteCase::IterateResult FragDepthWriteCase::iterate (void)
{
	TestLog&					log				= m_testCtx.getLog();
	const glw::Functions&		gl				= m_context.getRenderContext().getFunctions();
	de::Random					rnd				(deStringHash(getName()));
	const tcu::RenderTarget&	renderTarget	= m_context.getRenderContext().getRenderTarget();
	int							viewportW		= de::min(128, renderTarget.getWidth());
	int							viewportH		= de::min(128, renderTarget.getHeight());
	int							viewportX		= rnd.getInt(0, renderTarget.getWidth()-viewportW);
	int							viewportY		= rnd.getInt(0, renderTarget.getHeight()-viewportH);
	tcu::Surface				renderedFrame	(viewportW, viewportH);
	tcu::Surface				referenceFrame	(viewportW, viewportH);
	const int					numDepthSteps	= 16;
	const float					depthStep		= 1.0f/(float)(numDepthSteps-1);

	if (renderTarget.getDepthBits() == 0)
		throw tcu::NotSupportedError("Depth buffer is required", "", __FILE__, __LINE__);

	gl.viewport(viewportX, viewportY, viewportW, viewportH);
	gl.clear(GL_COLOR_BUFFER_BIT|GL_DEPTH_BUFFER_BIT|GL_STENCIL_BUFFER_BIT);
	gl.enable(GL_DEPTH_TEST);
	gl.depthFunc(GL_LESS);

	static const deUint16 quadIndices[] = { 0, 1, 2, 2, 1, 3 };

	// Render with given shader.
	{
		glu::ShaderProgram program(m_context.getRenderContext(), glu::makeVtxFragSources(s_vertexShaderSrc, m_fragSrc.c_str()));
		log << program;

		if (!program.isOk())
			TCU_FAIL("Compile failed");

		const float coord[] =
		{
			0.0f, 0.0f,
			0.0f, 1.0f,
			1.0f, 0.0f,
			1.0f, 1.0f
		};
		const float position[] =
		{
			-1.0f, -1.0f, +1.0f, 1.0f,
			-1.0f, +1.0f,  0.0f, 1.0f,
			+1.0f, -1.0f,  0.0f, 1.0f,
			+1.0f, +1.0f, -1.0f, 1.0f
		};

		gl.useProgram(program.getProgram());
		gl.uniform4f(gl.getUniformLocation(program.getProgram(), "u_color"), 0.0f, 1.0f, 0.0f, 1.0f);

		// Setup default helper uniforms.
		gls::setupDefaultUniforms(m_context.getRenderContext(), program.getProgram());

		{
			glu::VertexArrayBinding vertexArrays[] =
			{
				glu::va::Float("a_position",	4, 4, 0, &position[0]),
				glu::va::Float("a_coord",		2, 4, 0, &coord[0])
			};
			glu::draw(m_context.getRenderContext(), program.getProgram(), DE_LENGTH_OF_ARRAY(vertexArrays), &vertexArrays[0],
					  glu::pr::Triangles(DE_LENGTH_OF_ARRAY(quadIndices), &quadIndices[0]));
		}

		GLU_EXPECT_NO_ERROR(gl.getError(), "Draw test quad");
	}

	// Visualize by rendering full-screen quads with increasing depth and color.
	{
		glu::ShaderProgram program (m_context.getRenderContext(), glu::makeVtxFragSources(s_vertexShaderSrc, s_defaultFragmentShaderSrc));
		if (!program.isOk())
		{
			log << program;
			TCU_FAIL("Compile failed");
		}

		int posLoc		= gl.getAttribLocation(program.getProgram(), "a_position");
		int colorLoc	= gl.getUniformLocation(program.getProgram(), "u_color");

		gl.useProgram(program.getProgram());
		gl.depthMask(GL_FALSE);

		for (int stepNdx = 0; stepNdx < numDepthSteps; stepNdx++)
		{
			float	f		= (float)stepNdx*depthStep;
			float	depth	= f*2.0f - 1.0f;
			Vec4	color	= Vec4(f, f, f, 1.0f);

			const float position[] =
			{
				-1.0f, -1.0f, depth, 1.0f,
				-1.0f, +1.0f, depth, 1.0f,
				+1.0f, -1.0f, depth, 1.0f,
				+1.0f, +1.0f, depth, 1.0f
			};
			glu::VertexArrayBinding	posBinding = glu::va::Float(posLoc, 4, 4, 0, &position[0]);

			gl.uniform4fv(colorLoc, 1, color.getPtr());
			glu::draw(m_context.getRenderContext(), program.getProgram(), 1, &posBinding,
					  glu::pr::Triangles(DE_LENGTH_OF_ARRAY(quadIndices), &quadIndices[0]));
		}

		GLU_EXPECT_NO_ERROR(gl.getError(), "Visualization draw");
	}

	glu::readPixels(m_context.getRenderContext(), viewportX, viewportY, renderedFrame.getAccess());

	// Render reference.
	for (int y = 0; y < referenceFrame.getHeight(); y++)
	{
		for (int x = 0; x < referenceFrame.getWidth(); x++)
		{
			float	xf		= ((float)x + 0.5f) / (float)referenceFrame.getWidth();
			float	yf		= ((float)y + 0.5f) / (float)referenceFrame.getHeight();
			float	d		= m_evalFunc(Vec2(xf, yf));
			int		step	= (int)deFloatFloor(d / depthStep);
			int		col		= de::clamp(deRoundFloatToInt32((float)step*depthStep*255.0f), 0, 255);

			referenceFrame.setPixel(x, y, tcu::RGBA(col, col, col, 0xff));
		}
	}

	bool isOk = tcu::fuzzyCompare(log, "Result", "Image comparison result", referenceFrame, renderedFrame, 0.05f, tcu::COMPARE_LOG_RESULT);
	m_testCtx.setTestResult(isOk ? QP_TEST_RESULT_PASS	: QP_TEST_RESULT_FAIL,
							isOk ? "Pass"				: "Fail");
	return STOP;
}